

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::MergeReturnPass::CreatePhiNodesForInst
          (MergeReturnPass *this,BasicBlock *merge_block,Instruction *inst)

{
  DominatorAnalysis *pDVar1;
  bool bVar2;
  uint32_t uVar3;
  Op OVar4;
  Analysis preserved_analyses;
  IRContext *pIVar5;
  Function *f;
  DefUseManager *pDVar6;
  CFG *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  reference puVar7;
  size_type sVar8;
  Instruction *pIVar9;
  FeatureManager *this_01;
  pointer this_02;
  reference ppIVar10;
  anon_class_16_2_33377ab0 local_1e0;
  function<void_(unsigned_int_*)> local_1d0;
  Instruction *local_1b0;
  Instruction *user;
  iterator __end3_1;
  iterator __begin3_1;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range3_1;
  undefined1 local_188 [4];
  uint32_t result_of_phi;
  undefined1 local_180 [8];
  InstructionBuilder builder;
  function<void_(unsigned_int_*)> local_148;
  undefined1 local_128 [16];
  Instruction *insert_pos;
  uint32_t new_id;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  regen_inst;
  StorageClass storage_class;
  bool regenerateInstruction;
  Instruction *inst_type;
  Instruction *new_phi;
  iterator iStack_e8;
  uint32_t pred_id;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> preds;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *new_edges;
  vector<unsigned_int,_std::allocator<unsigned_int>_> phi_operands;
  uint32_t undef_id;
  BasicBlock **local_88;
  Instruction *local_80;
  BasicBlock *local_78;
  MergeReturnPass *local_70;
  function<void_(spvtools::opt::Instruction_*)> local_68;
  undefined1 local_48 [8];
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  users_to_update;
  BasicBlock *inst_bb;
  DominatorAnalysis *dom_tree;
  Instruction *inst_local;
  BasicBlock *merge_block_local;
  MergeReturnPass *this_local;
  
  dom_tree = (DominatorAnalysis *)inst;
  inst_local = (Instruction *)merge_block;
  merge_block_local = (BasicBlock *)this;
  pIVar5 = Pass::context((Pass *)this);
  f = BasicBlock::GetParent((BasicBlock *)inst_local);
  inst_bb = (BasicBlock *)IRContext::GetDominatorAnalysis(pIVar5,f);
  uVar3 = opt::Instruction::result_id((Instruction *)dom_tree);
  if (uVar3 != 0) {
    pIVar5 = Pass::context((Pass *)this);
    users_to_update.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)IRContext::get_instr_block(pIVar5,(Instruction *)dom_tree);
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)local_48);
    pIVar5 = Pass::context((Pass *)this);
    pDVar6 = IRContext::get_def_use_mgr(pIVar5);
    pDVar1 = dom_tree;
    _undef_id = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 *)local_48;
    local_88 = &inst_bb;
    local_80 = (Instruction *)dom_tree;
    local_78 = (BasicBlock *)
               users_to_update.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_70 = this;
    std::function<void(spvtools::opt::Instruction*)>::
    function<spvtools::opt::MergeReturnPass::CreatePhiNodesForInst(spvtools::opt::BasicBlock*,spvtools::opt::Instruction&)::__0,void>
              ((function<void(spvtools::opt::Instruction*)> *)&local_68,
               (anon_class_40_5_3b5fd2a8 *)&undef_id);
    analysis::DefUseManager::ForEachUser(pDVar6,(Instruction *)pDVar1,&local_68);
    std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_68);
    bVar2 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ::empty((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     *)local_48);
    if (bVar2) {
      phi_operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    else {
      uVar3 = opt::Instruction::type_id((Instruction *)dom_tree);
      phi_operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           MemPass::Type2Undef(&this->super_MemPass,uVar3);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&new_edges);
      preds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    unordered_map<spvtools::opt::BasicBlock_*,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                    ::operator[](&this->new_edges_,(key_type *)&inst_local);
      this_00 = Pass::cfg((Pass *)this);
      uVar3 = BasicBlock::id((BasicBlock *)inst_local);
      __x = CFG::preds(this_00,uVar3);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3,__x);
      __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3);
      iStack_e8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3);
      while (bVar2 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffff18), bVar2) {
        puVar7 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end3);
        new_phi._4_4_ = *puVar7;
        sVar8 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      preds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                      (key_type_conflict *)((long)&new_phi + 4));
        if (sVar8 == 0) {
          new_phi._0_4_ = opt::Instruction::result_id((Instruction *)dom_tree);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&new_edges,
                     (value_type_conflict *)&new_phi);
        }
        else {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&new_edges,
                     (value_type_conflict *)
                     &phi_operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&new_edges,
                   (value_type_conflict *)((long)&new_phi + 4));
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end3);
      }
      pDVar6 = Pass::get_def_use_mgr((Pass *)this);
      uVar3 = opt::Instruction::type_id((Instruction *)dom_tree);
      pIVar9 = analysis::DefUseManager::GetDef(pDVar6,uVar3);
      regen_inst._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._7_1_ = 0;
      OVar4 = opt::Instruction::opcode(pIVar9);
      if (OVar4 == OpTypePointer) {
        pIVar5 = Pass::context((Pass *)this);
        this_01 = IRContext::get_feature_mgr(pIVar5);
        bVar2 = FeatureManager::HasCapability(this_01,CapabilityVariablePointers);
        if (!bVar2) {
          regen_inst._M_t.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._7_1_ = 1;
        }
        regen_inst._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._0_4_ =
             opt::Instruction::GetSingleWordInOperand(pIVar9,0);
        if (((uint32_t)
             regen_inst._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl != 4) &&
           ((uint32_t)
            regen_inst._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl != 0xc)) {
          regen_inst._M_t.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._7_1_ = 1;
        }
      }
      pDVar1 = dom_tree;
      if ((regen_inst._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._7_1_ & 1) == 0)
      {
        pIVar5 = Pass::context((Pass *)this);
        BasicBlock::begin((BasicBlock *)local_188);
        pIVar9 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator*
                           ((iterator_template<spvtools::opt::Instruction> *)local_188);
        preserved_analyses = opt::operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
        InstructionBuilder::InstructionBuilder
                  ((InstructionBuilder *)local_180,pIVar5,pIVar9,preserved_analyses);
        uVar3 = opt::Instruction::type_id((Instruction *)dom_tree);
        inst_type = InstructionBuilder::AddPhi
                              ((InstructionBuilder *)local_180,uVar3,
                               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&new_edges,0);
      }
      else {
        pIVar5 = Pass::context((Pass *)this);
        pIVar9 = opt::Instruction::Clone((Instruction *)pDVar1,pIVar5);
        std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
        ::unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                  ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                    *)&stack0xfffffffffffffef0,pIVar9);
        insert_pos._4_4_ = Pass::TakeNextId((Pass *)this);
        this_02 = std::
                  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ::operator->((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                *)&stack0xfffffffffffffef0);
        opt::Instruction::SetResultId(this_02,insert_pos._4_4_);
        BasicBlock::begin((BasicBlock *)local_128);
        local_128._8_8_ =
             utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*
                       ((iterator_template<spvtools::opt::Instruction> *)local_128);
        while (OVar4 = opt::Instruction::opcode((Instruction *)local_128._8_8_), OVar4 == OpPhi) {
          local_128._8_8_ =
               utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                         ((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_128._8_8_);
        }
        inst_type = opt::Instruction::InsertBefore
                              ((Instruction *)local_128._8_8_,
                               (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                *)&stack0xfffffffffffffef0);
        pDVar6 = Pass::get_def_use_mgr((Pass *)this);
        analysis::DefUseManager::AnalyzeInstDefUse(pDVar6,inst_type);
        pIVar5 = Pass::context((Pass *)this);
        IRContext::set_instr_block(pIVar5,inst_type,(BasicBlock *)inst_local);
        builder._24_8_ = inst_bb;
        std::function<void(unsigned_int*)>::
        function<spvtools::opt::MergeReturnPass::CreatePhiNodesForInst(spvtools::opt::BasicBlock*,spvtools::opt::Instruction&)::__1,void>
                  ((function<void(unsigned_int*)> *)&local_148,
                   (anon_class_24_3_aa428448 *)&builder.preserved_analyses_);
        opt::Instruction::ForEachInId(inst_type,&local_148);
        std::function<void_(unsigned_int_*)>::~function(&local_148);
        std::
        unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
        ~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     *)&stack0xfffffffffffffef0);
      }
      uVar3 = opt::Instruction::result_id(inst_type);
      __end3_1 = std::
                 vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ::begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          *)local_48);
      user = (Instruction *)
             std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)local_48);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                 *)&user), bVar2) {
        ppIVar10 = __gnu_cxx::
                   __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                   ::operator*(&__end3_1);
        pIVar9 = *ppIVar10;
        local_1e0.inst = (Instruction *)dom_tree;
        local_1e0.result_of_phi = uVar3;
        local_1b0 = pIVar9;
        std::function<void(unsigned_int*)>::
        function<spvtools::opt::MergeReturnPass::CreatePhiNodesForInst(spvtools::opt::BasicBlock*,spvtools::opt::Instruction&)::__2,void>
                  ((function<void(unsigned_int*)> *)&local_1d0,&local_1e0);
        opt::Instruction::ForEachInId(pIVar9,&local_1d0);
        std::function<void_(unsigned_int_*)>::~function(&local_1d0);
        pIVar5 = Pass::context((Pass *)this);
        IRContext::AnalyzeUses(pIVar5,local_1b0);
        __gnu_cxx::
        __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
        ::operator++(&__end3_1);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&new_edges);
      phi_operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
            local_48);
  }
  return;
}

Assistant:

void MergeReturnPass::CreatePhiNodesForInst(BasicBlock* merge_block,
                                            Instruction& inst) {
  DominatorAnalysis* dom_tree =
      context()->GetDominatorAnalysis(merge_block->GetParent());

  if (inst.result_id() != 0) {
    BasicBlock* inst_bb = context()->get_instr_block(&inst);
    std::vector<Instruction*> users_to_update;
    context()->get_def_use_mgr()->ForEachUser(
        &inst,
        [&users_to_update, &dom_tree, &inst, inst_bb, this](Instruction* user) {
          BasicBlock* user_bb = nullptr;
          if (user->opcode() != spv::Op::OpPhi) {
            user_bb = context()->get_instr_block(user);
          } else {
            // For OpPhi, the use should be considered to be in the predecessor.
            for (uint32_t i = 0; i < user->NumInOperands(); i += 2) {
              if (user->GetSingleWordInOperand(i) == inst.result_id()) {
                uint32_t user_bb_id = user->GetSingleWordInOperand(i + 1);
                user_bb = context()->get_instr_block(user_bb_id);
                break;
              }
            }
          }

          // If |user_bb| is nullptr, then |user| is not in the function.  It is
          // something like an OpName or decoration, which should not be
          // replaced with the result of the OpPhi.
          if (user_bb && !dom_tree->Dominates(inst_bb, user_bb)) {
            users_to_update.push_back(user);
          }
        });

    if (users_to_update.empty()) {
      return;
    }

    // There is at least one values that needs to be replaced.
    // First create the OpPhi instruction.
    uint32_t undef_id = Type2Undef(inst.type_id());
    std::vector<uint32_t> phi_operands;
    const std::set<uint32_t>& new_edges = new_edges_[merge_block];

    // Add the OpPhi operands. If the predecessor is a return block use undef,
    // otherwise use |inst|'s id.
    std::vector<uint32_t> preds = cfg()->preds(merge_block->id());
    for (uint32_t pred_id : preds) {
      if (new_edges.count(pred_id)) {
        phi_operands.push_back(undef_id);
      } else {
        phi_operands.push_back(inst.result_id());
      }
      phi_operands.push_back(pred_id);
    }

    Instruction* new_phi = nullptr;
    // If the instruction is a pointer and variable pointers are not an option,
    // then we have to regenerate the instruction instead of creating an OpPhi
    // instruction.  If not, the Spir-V will be invalid.
    Instruction* inst_type = get_def_use_mgr()->GetDef(inst.type_id());
    bool regenerateInstruction = false;
    if (inst_type->opcode() == spv::Op::OpTypePointer) {
      if (!context()->get_feature_mgr()->HasCapability(
              spv::Capability::VariablePointers)) {
        regenerateInstruction = true;
      }

      auto storage_class =
          spv::StorageClass(inst_type->GetSingleWordInOperand(0));
      if (storage_class != spv::StorageClass::Workgroup &&
          storage_class != spv::StorageClass::StorageBuffer) {
        regenerateInstruction = true;
      }
    }

    if (regenerateInstruction) {
      std::unique_ptr<Instruction> regen_inst(inst.Clone(context()));
      uint32_t new_id = TakeNextId();
      regen_inst->SetResultId(new_id);
      Instruction* insert_pos = &*merge_block->begin();
      while (insert_pos->opcode() == spv::Op::OpPhi) {
        insert_pos = insert_pos->NextNode();
      }
      new_phi = insert_pos->InsertBefore(std::move(regen_inst));
      get_def_use_mgr()->AnalyzeInstDefUse(new_phi);
      context()->set_instr_block(new_phi, merge_block);

      new_phi->ForEachInId([dom_tree, merge_block, this](uint32_t* use_id) {
        Instruction* use = get_def_use_mgr()->GetDef(*use_id);
        BasicBlock* use_bb = context()->get_instr_block(use);
        if (use_bb != nullptr && !dom_tree->Dominates(use_bb, merge_block)) {
          CreatePhiNodesForInst(merge_block, *use);
        }
      });
    } else {
      InstructionBuilder builder(
          context(), &*merge_block->begin(),
          IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
      new_phi = builder.AddPhi(inst.type_id(), phi_operands);
    }
    uint32_t result_of_phi = new_phi->result_id();

    // Update all of the users to use the result of the new OpPhi.
    for (Instruction* user : users_to_update) {
      user->ForEachInId([&inst, result_of_phi](uint32_t* id) {
        if (*id == inst.result_id()) {
          *id = result_of_phi;
        }
      });
      context()->AnalyzeUses(user);
    }
  }
}